

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode
CopyUncompressedBlockToOutput
          (size_t *available_out,uint8_t **next_out,size_t *total_out,BrotliDecoderStateInternal *s)

{
  size_t *psVar1;
  uint8_t **ppuVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BrotliDecoderErrorCode BVar7;
  BrotliRunningUncompressedState BVar8;
  size_t __n;
  size_t sVar9;
  uint32_t uVar10;
  uint8_t *__dest;
  bool bVar11;
  
  iVar5 = BrotliEnsureRingBuffer(s);
  if (iVar5 == 0) {
    return BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1;
  }
  BVar8 = s->substate_uncompressed;
LAB_001027e6:
  if (BVar8 != BROTLI_STATE_UNCOMPRESSED_WRITE) goto code_r0x001027ef;
  goto LAB_001028ad;
code_r0x001027ef:
  if (BVar8 == BROTLI_STATE_UNCOMPRESSED_NONE) {
    uVar10 = (s->br).bit_pos_;
    iVar5 = (0x40 - uVar10 >> 3) + (int)(s->br).avail_in;
    if (s->meta_block_remaining_len < iVar5) {
      iVar5 = s->meta_block_remaining_len;
    }
    iVar6 = s->pos;
    iVar4 = s->ringbuffer_size - iVar6;
    if (iVar5 + iVar6 <= s->ringbuffer_size) {
      iVar4 = iVar5;
    }
    __dest = s->ringbuffer + iVar6;
    __n = (size_t)iVar4;
    if ((uVar10 - 0x41 < 0xfffffff8) && (sVar9 = __n, iVar4 != 0)) {
      do {
        *__dest = (uint8_t)((s->br).val_ >> ((byte)uVar10 & 0x3f));
        uVar3 = (s->br).bit_pos_;
        uVar10 = uVar3 + 8;
        (s->br).bit_pos_ = uVar10;
        __dest = __dest + 1;
        __n = sVar9 - 1;
        if (0xfffffff7 < uVar3 - 0x39) break;
        bVar11 = sVar9 != 1;
        sVar9 = __n;
      } while (bVar11);
    }
    memcpy(__dest,(s->br).next_in,__n);
    psVar1 = &(s->br).avail_in;
    *psVar1 = *psVar1 - __n;
    ppuVar2 = &(s->br).next_in;
    *ppuVar2 = *ppuVar2 + __n;
    iVar6 = s->pos + iVar4;
    s->pos = iVar6;
    iVar5 = s->meta_block_remaining_len;
    s->meta_block_remaining_len = iVar5 - iVar4;
    if (iVar6 < 1 << ((byte)s->window_bits & 0x1f)) {
      return (uint)(iVar5 != iVar4) + BROTLI_DECODER_SUCCESS;
    }
    s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
LAB_001028ad:
    BVar7 = WriteRingBuffer(s,available_out,next_out,total_out,0);
    if (BVar7 != BROTLI_DECODER_SUCCESS) {
      return BVar7;
    }
    if (s->ringbuffer_size == 1 << ((byte)s->window_bits & 0x1f)) {
      s->max_distance = s->max_backward_distance;
    }
    s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
    BVar8 = BROTLI_STATE_UNCOMPRESSED_NONE;
  }
  goto LAB_001027e6;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE CopyUncompressedBlockToOutput(
    size_t* available_out, uint8_t** next_out, size_t* total_out,
    BrotliDecoderState* s) {
  /* TODO: avoid allocation for single uncompressed block. */
  if (!BrotliEnsureRingBuffer(s)) {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1);
  }

  /* State machine */
  for (;;) {
    switch (s->substate_uncompressed) {
      case BROTLI_STATE_UNCOMPRESSED_NONE: {
        int nbytes = (int)BrotliGetRemainingBytes(&s->br);
        if (nbytes > s->meta_block_remaining_len) {
          nbytes = s->meta_block_remaining_len;
        }
        if (s->pos + nbytes > s->ringbuffer_size) {
          nbytes = s->ringbuffer_size - s->pos;
        }
        /* Copy remaining bytes from s->br.buf_ to ring-buffer. */
        BrotliCopyBytes(&s->ringbuffer[s->pos], &s->br, (size_t)nbytes);
        s->pos += nbytes;
        s->meta_block_remaining_len -= nbytes;
        if (s->pos < 1 << s->window_bits) {
          if (s->meta_block_remaining_len == 0) {
            return BROTLI_DECODER_SUCCESS;
          }
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
        /* No break, continue to next state */
      }
      case BROTLI_STATE_UNCOMPRESSED_WRITE: {
        BrotliDecoderErrorCode result;
        result = WriteRingBuffer(
            s, available_out, next_out, total_out, BROTLI_FALSE);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
        if (s->ringbuffer_size == 1 << s->window_bits) {
          s->max_distance = s->max_backward_distance;
        }
        s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
        break;
      }
    }
  }
  BROTLI_DCHECK(0);  /* Unreachable */
}